

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecSat.c
# Opt level: O0

void Cec2_CollectSuper_rec(Gia_Man_t *p,Gia_Obj_t *pObj,Vec_Ptr_t *vSuper,int fFirst,int fUseMuxes)

{
  int iVar1;
  Gia_Obj_t *pGVar2;
  int local_2c;
  int fUseMuxes_local;
  int fFirst_local;
  Vec_Ptr_t *vSuper_local;
  Gia_Obj_t *pObj_local;
  Gia_Man_t *p_local;
  
  iVar1 = Gia_IsComplement(pObj);
  if ((iVar1 == 0) && (iVar1 = Gia_ObjIsCi(pObj), iVar1 == 0)) {
    if (fFirst == 0) {
      if (p->pRefs == (int *)0x0) {
        local_2c = Gia_ObjValue(pObj);
      }
      else {
        local_2c = Gia_ObjRefNum(p,pObj);
      }
      if (1 < local_2c) goto LAB_007ef13b;
    }
    if ((fUseMuxes == 0) || ((*(ulong *)pObj >> 0x1e & 1) == 0)) {
      pGVar2 = Gia_ObjChild0(pObj);
      Cec2_CollectSuper_rec(p,pGVar2,vSuper,0,fUseMuxes);
      pGVar2 = Gia_ObjChild1(pObj);
      Cec2_CollectSuper_rec(p,pGVar2,vSuper,0,fUseMuxes);
      return;
    }
  }
LAB_007ef13b:
  Vec_PtrPushUnique(vSuper,pObj);
  return;
}

Assistant:

void Cec2_CollectSuper_rec( Gia_Man_t * p, Gia_Obj_t * pObj, Vec_Ptr_t * vSuper, int fFirst, int fUseMuxes )
{
    // if the new node is complemented or a PI, another gate begins
    if ( Gia_IsComplement(pObj) || Gia_ObjIsCi(pObj) || 
         (!fFirst && (p->pRefs ? Gia_ObjRefNum(p, pObj) : Gia_ObjValue(pObj)) > 1) || 
         (fUseMuxes && pObj->fMark0) )
    {
        Vec_PtrPushUnique( vSuper, pObj );
        return;
    }
    // go through the branches
    Cec2_CollectSuper_rec( p, Gia_ObjChild0(pObj), vSuper, 0, fUseMuxes );
    Cec2_CollectSuper_rec( p, Gia_ObjChild1(pObj), vSuper, 0, fUseMuxes );
}